

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerRewriting.cpp
# Opt level: O3

bool __thiscall
Inferences::InnerRewriting::perform
          (InnerRewriting *this,Clause *cl,Clause **replacement,ClauseIterator *premises)

{
  Ordering *ord;
  Literal *eq;
  Literal *lit;
  bool bVar1;
  Literal *pLVar2;
  Literal **ppLVar3;
  Clause *pCVar4;
  ulong uVar5;
  uint uVar6;
  Literal ***pppLVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  RStack<Literal_*> resLits;
  TermList rhs;
  TermList lhs;
  Literal *local_b0;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_98;
  TermList local_88;
  TermList local_80;
  Clause **local_78;
  SimplifyingInference1 local_70;
  Inference local_60;
  
  uVar6 = (uint)*(ulong *)&cl->field_0x38;
  if ((*(ulong *)&cl->field_0x38 & 0xfffff) != 0) {
    ord = (((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->_ordering)._obj;
    uVar9 = (ulong)(uVar6 & 0xfffff);
    bVar11 = true;
    uVar8 = 0;
    local_78 = replacement;
    do {
      eq = cl->_literals[uVar8];
      local_80._content = 2;
      local_88._content = 2;
      if ((((eq->super_Term)._functor == 0) && (((eq->super_Term)._args[0]._content & 4) == 0)) &&
         (bVar1 = Kernel::EqHelper::hasGreaterEqualitySide(eq,ord,&local_80,&local_88), bVar1)) {
        uVar10 = 0;
        do {
          if ((uVar8 != uVar10) &&
             (lit = cl->_literals[uVar10], pLVar2 = Kernel::EqHelper::replace(lit,local_80,local_88)
             , pLVar2 != lit)) {
            if (((pLVar2->super_Term)._functor == 0) &&
               ((((pLVar2->super_Term)._args[0]._content & 4) != 0 &&
                (uVar9 = (ulong)(*(uint *)&(pLVar2->super_Term).field_0xc & 0xfffffff),
                (pLVar2->super_Term)._args[uVar9]._content ==
                (pLVar2->super_Term)._args[uVar9 - 1]._content)))) {
              *(int *)(DAT_00b521c0 + 0x1a4) = *(int *)(DAT_00b521c0 + 0x1a4) + 1;
              return bVar11;
            }
            Lib::
            Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            Recycled(&local_98);
            uVar9 = 0;
            goto LAB_004ee848;
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      uVar8 = uVar8 + 1;
      bVar11 = uVar8 < uVar9;
    } while (uVar8 != uVar9);
  }
  return false;
LAB_004ee848:
  if (uVar8 == uVar9) {
    pppLVar7 = (Literal ***)
               ((long)local_98._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x10);
    ppLVar3 = *(Literal ***)
               ((long)local_98._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x10);
    if (ppLVar3 ==
        *(Literal ***)
         ((long)local_98._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x18))
    {
      Lib::Stack<Kernel::Literal_*>::expand
                ((Stack<Kernel::Literal_*> *)
                 local_98._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
      ppLVar3 = *pppLVar7;
    }
    *ppLVar3 = eq;
  }
  else {
    if (uVar9 < uVar10) {
      local_b0 = cl->_literals[uVar9];
      pppLVar7 = (Literal ***)
                 ((long)local_98._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      ppLVar3 = *(Literal ***)
                 ((long)local_98._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      if (ppLVar3 ==
          *(Literal ***)
           ((long)local_98._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x18
           )) {
        Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   local_98._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
LAB_004ee920:
        ppLVar3 = *pppLVar7;
      }
    }
    else {
      if (uVar9 == uVar10) {
        pppLVar7 = (Literal ***)
                   ((long)local_98._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        ppLVar3 = *(Literal ***)
                   ((long)local_98._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        if (ppLVar3 ==
            *(Literal ***)
             ((long)local_98._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x18)) {
          Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     local_98._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
          ppLVar3 = *pppLVar7;
        }
        *ppLVar3 = pLVar2;
        goto LAB_004ee92b;
      }
      local_b0 = Kernel::EqHelper::replace(cl->_literals[uVar9],local_80,local_88);
      if ((((local_b0->super_Term)._functor == 0) &&
          (((local_b0->super_Term)._args[0]._content & 4) != 0)) &&
         (uVar5 = (ulong)(*(uint *)&(local_b0->super_Term).field_0xc & 0xfffffff),
         (local_b0->super_Term)._args[uVar5]._content ==
         (local_b0->super_Term)._args[uVar5 - 1]._content)) {
        *(int *)(DAT_00b521c0 + 0x1a4) = *(int *)(DAT_00b521c0 + 0x1a4) + 1;
        goto LAB_004ee987;
      }
      pppLVar7 = (Literal ***)
                 ((long)local_98._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      ppLVar3 = *(Literal ***)
                 ((long)local_98._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      if (ppLVar3 ==
          *(Literal ***)
           ((long)local_98._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x18
           )) {
        Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   local_98._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
        goto LAB_004ee920;
      }
    }
    *ppLVar3 = local_b0;
  }
LAB_004ee92b:
  *pppLVar7 = *pppLVar7 + 1;
  uVar9 = uVar9 + 1;
  if ((uVar6 & 0xfffff) == uVar9) {
    *(int *)(DAT_00b521c0 + 0x1a0) = *(int *)(DAT_00b521c0 + 0x1a0) + 1;
    local_70.rule = INNER_REWRITING;
    local_70.premise = cl;
    Kernel::Inference::Inference(&local_60,&local_70);
    pCVar4 = Kernel::Clause::fromStack
                       ((Stack<Kernel::Literal_*> *)
                        local_98._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                        &local_60);
    *local_78 = pCVar4;
LAB_004ee987:
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&local_98);
    return bVar11;
  }
  goto LAB_004ee848;
}

Assistant:

bool InnerRewriting::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  Ordering& ordering = _salg->getOrdering();

  // look for the first equality which rewrites something and rewrite everything with it (check for EqTaut as you go)
  unsigned len = cl->length();
  for (unsigned i = 0; i < len; i++) {
    Literal* rwLit=(*cl)[i];
    TermList lhs, rhs;
    if (rwLit->isEquality() && rwLit->isNegative() && EqHelper::hasGreaterEqualitySide(rwLit,ordering,lhs,rhs)) {
      for (unsigned j = 0; j < len; j++) {
        if (i != j) {
          Literal* lit = (*cl)[j];
          Literal* nLit = EqHelper::replace(lit,lhs,rhs);
          if (nLit != lit) {
            if(EqHelper::isEqTautology(nLit)) {
              env.statistics->innerRewritesToEqTaut++;
              return true;
            }

            RStack<Literal*> resLits;

            for (unsigned k = 0; k < len; k++) {
              if (k == i) {
                resLits->push(rwLit);
              } else if (k < j) {
                resLits->push((*cl)[k]);
              } else if (k == j) {
                resLits->push(nLit);
              } else {
                Literal* oLit = (*cl)[k];
                Literal* rLit = EqHelper::replace(oLit,lhs,rhs);
                if(EqHelper::isEqTautology(rLit)) {
                  env.statistics->innerRewritesToEqTaut++;
                  return true;
                }
                resLits->push(rLit);
              }
            }

            env.statistics->innerRewrites++;

            replacement = Clause::fromStack(*resLits,SimplifyingInference1(InferenceRule::INNER_REWRITING, cl));
            return true;
          }
        }
      }
    }
  }

  return false;
}